

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * __thiscall
doctest::String::operator+(String *__return_storage_ptr__,String *this,String *other)

{
  EVP_PKEY_CTX *src;
  uint uVar1;
  anon_union_24_2_13149d16_for_String_2 local_38;
  
  if ((this->field_0).buf[0x17] < '\0') {
    local_38.buf[0x17] = 0x80;
    local_38.data.size = (this->field_0).data.size;
    uVar1 = local_38.data.size + 1;
    local_38.data.capacity = uVar1;
    local_38.data.ptr = (char *)operator_new__((ulong)uVar1);
    memcpy(local_38.data.ptr,(this->field_0).data.ptr,(ulong)uVar1);
  }
  else {
    local_38._16_8_ = *(long *)((long)&this->field_0 + 0x10);
    local_38.data.ptr = (this->field_0).data.ptr;
    local_38._8_8_ = *(undefined8 *)((long)&this->field_0 + 8);
  }
  operator+=((String *)&local_38.data,other);
  copy(__return_storage_ptr__,(EVP_PKEY_CTX *)&local_38.data,src);
  if (((long)local_38._16_8_ < 0) && (local_38.data.ptr != (char *)0x0)) {
    operator_delete__(local_38.data.ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

String String::operator+(const String& other) const { return String(*this) += other; }